

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_do_read_interlace
               (png_row_infop row_info,png_bytep row,int pass,png_uint_32 transformations)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  png_bytep __src;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  png_bytep __dest;
  uint uVar14;
  png_uint_32 pVar15;
  bool bVar16;
  png_byte v [8];
  
  if (row_info != (png_row_infop)0x0 && row != (png_bytep)0x0) {
    pVar15 = row_info->width;
    uVar14 = png_do_read_interlace::png_pass_inc[pass];
    uVar12 = uVar14 * pVar15;
    bVar1 = row_info->pixel_depth;
    if (bVar1 == 4) {
      uVar2 = pVar15 * 4 & 4;
      if ((transformations >> 0x10 & 1) == 0) {
        uVar8 = uVar12 * 4 & 4;
        uVar11 = 4;
        uVar4 = 0;
        uVar9 = uVar11;
      }
      else {
        uVar2 = uVar2 ^ 4;
        uVar8 = (~uVar12 & 1) << 2;
        uVar9 = 0xfffffffc;
        uVar11 = 0;
        uVar4 = 4;
      }
      pbVar5 = row + (pVar15 - 1 >> 1);
      pbVar10 = row + (uVar12 - 1 >> 1);
      uVar7 = 0;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      for (; uVar7 < pVar15; uVar7 = uVar7 + 1) {
        bVar1 = *pbVar5;
        uVar6 = uVar14;
        while (bVar16 = uVar6 != 0, uVar6 = uVar6 - 1, bVar16) {
          *pbVar10 = (byte)((bVar1 >> ((byte)uVar2 & 0x1f) & 0xf) << ((byte)uVar8 & 0x1f)) |
                     (byte)(0xf0f >> (4 - (byte)uVar8 & 0x1f)) & *pbVar10;
          bVar16 = uVar8 == uVar11;
          uVar8 = uVar8 + uVar9;
          if (bVar16) {
            uVar8 = uVar4;
          }
          pbVar10 = pbVar10 + -(ulong)bVar16;
        }
        bVar16 = uVar2 == uVar11;
        uVar2 = uVar2 + uVar9;
        if (bVar16) {
          uVar2 = uVar4;
        }
        pbVar5 = pbVar5 + -(ulong)bVar16;
        pVar15 = row_info->width;
      }
    }
    else if (bVar1 == 2) {
      uVar2 = pVar15 * 2 + 6 & 6;
      if ((transformations >> 0x10 & 1) == 0) {
        uVar2 = uVar2 ^ 6;
        uVar4 = ~(uVar12 * 2 + 6);
        iVar13 = 2;
        uVar11 = 6;
        uVar9 = 0;
      }
      else {
        uVar4 = uVar12 * 2 + 6;
        iVar13 = -2;
        uVar11 = 0;
        uVar9 = 6;
      }
      uVar4 = uVar4 & 6;
      pbVar5 = row + (pVar15 - 1 >> 2);
      pbVar10 = row + (uVar12 - 1 >> 2);
      uVar8 = 0;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      for (; uVar8 < pVar15; uVar8 = uVar8 + 1) {
        bVar1 = *pbVar5;
        uVar7 = uVar14;
        while (bVar16 = uVar7 != 0, uVar7 = uVar7 - 1, bVar16) {
          *pbVar10 = (byte)((bVar1 >> ((byte)uVar2 & 0x1f) & 3) << ((byte)uVar4 & 0x1f)) |
                     (byte)(0x3f3f >> (6 - (byte)uVar4 & 0x1f)) & *pbVar10;
          bVar16 = uVar4 == uVar11;
          uVar4 = uVar4 + iVar13;
          if (bVar16) {
            uVar4 = uVar9;
          }
          pbVar10 = pbVar10 + -(ulong)bVar16;
        }
        bVar16 = uVar2 == uVar11;
        uVar2 = uVar2 + iVar13;
        if (bVar16) {
          uVar2 = uVar9;
        }
        pbVar5 = pbVar5 + -(ulong)bVar16;
        pVar15 = row_info->width;
      }
    }
    else if (bVar1 == 1) {
      uVar2 = uVar12 - 1;
      uVar9 = uVar2 >> 3;
      uVar11 = pVar15 - 1 & 7;
      if ((transformations >> 0x10 & 1) == 0) {
        uVar11 = uVar11 ^ 7;
        uVar2 = -uVar12;
        uVar8 = 0;
        uVar4 = 7;
        iVar13 = 1;
      }
      else {
        uVar8 = 7;
        uVar4 = 0;
        iVar13 = -1;
      }
      uVar2 = uVar2 & 7;
      pbVar5 = row + (pVar15 - 1 >> 3);
      pbVar10 = row + uVar9;
      uVar9 = 0;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      for (; uVar9 < pVar15; uVar9 = uVar9 + 1) {
        bVar1 = *pbVar5;
        uVar7 = uVar14;
        while (bVar16 = uVar7 != 0, uVar7 = uVar7 - 1, bVar16) {
          *pbVar10 = ((bVar1 >> (uVar11 & 0x1f) & 1) != 0) << ((byte)uVar2 & 0x1f) |
                     (byte)(0x7f7f >> (7 - (byte)uVar2 & 0x1f)) & *pbVar10;
          bVar16 = uVar2 == uVar4;
          uVar2 = uVar2 + iVar13;
          if (bVar16) {
            uVar2 = uVar8;
          }
          pbVar10 = pbVar10 + -(ulong)bVar16;
        }
        bVar16 = uVar11 == uVar4;
        uVar11 = uVar11 + iVar13;
        if (bVar16) {
          uVar11 = uVar8;
        }
        pbVar5 = pbVar5 + -(ulong)bVar16;
        pVar15 = row_info->width;
      }
    }
    else {
      uVar3 = (ulong)(bVar1 >> 3);
      __src = row + (pVar15 - 1) * uVar3;
      __dest = row + (uVar12 - 1) * uVar3;
      uVar2 = 0;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      for (; uVar2 < pVar15; uVar2 = uVar2 + 1) {
        memcpy(v,__src,uVar3);
        uVar11 = uVar14;
        while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
          memcpy(__dest,v,uVar3);
          __dest = __dest + -uVar3;
        }
        __src = __src + -uVar3;
        pVar15 = row_info->width;
      }
    }
    row_info->width = uVar12;
    bVar1 = row_info->pixel_depth;
    if ((ulong)bVar1 < 8) {
      uVar3 = (ulong)bVar1 * (ulong)uVar12 + 7 >> 3;
    }
    else {
      uVar3 = (ulong)(bVar1 >> 3) * (ulong)uVar12;
    }
    row_info->rowbytes = uVar3;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_read_interlace(png_row_infop row_info, png_bytep row, int pass,
    png_uint_32 transformations /* Because these may affect the byte layout */)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */
   /* Offset to next interlace block */
   static PNG_CONST unsigned int png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   png_debug(1, "in png_do_read_interlace");
   if (row != NULL && row_info != NULL)
   {
      png_uint_32 final_width;

      final_width = row_info->width * png_pass_inc[pass];

      switch (row_info->pixel_depth)
      {
         case 1:
         {
            png_bytep sp = row + (png_size_t)((row_info->width - 1) >> 3);
            png_bytep dp = row + (png_size_t)((final_width - 1) >> 3);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            int jstop = (int)png_pass_inc[pass];
            png_byte v;
            png_uint_32 i;
            int j;

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
                sshift = ((row_info->width + 7) & 0x07);
                dshift = ((final_width + 7) & 0x07);
                s_start = 7;
                s_end = 0;
                s_inc = -1;
            }

            else
#endif
            {
                sshift = 7 - ((row_info->width + 7) & 0x07);
                dshift = 7 - ((final_width + 7) & 0x07);
                s_start = 0;
                s_end = 7;
                s_inc = 1;
            }

            for (i = 0; i < row_info->width; i++)
            {
               v = (png_byte)((*sp >> sshift) & 0x01);
               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0x7f7f >> (7 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         case 2:
         {
            png_bytep sp = row + (png_uint_32)((row_info->width - 1) >> 2);
            png_bytep dp = row + (png_uint_32)((final_width - 1) >> 2);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            int jstop = (int)png_pass_inc[pass];
            png_uint_32 i;

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
               sshift = (((row_info->width + 3) & 0x03) << 1);
               dshift = (((final_width + 3) & 0x03) << 1);
               s_start = 6;
               s_end = 0;
               s_inc = -2;
            }

            else
#endif
            {
               sshift = ((3 - ((row_info->width + 3) & 0x03)) << 1);
               dshift = ((3 - ((final_width + 3) & 0x03)) << 1);
               s_start = 0;
               s_end = 6;
               s_inc = 2;
            }

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v;
               int j;

               v = (png_byte)((*sp >> sshift) & 0x03);
               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0x3f3f >> (6 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         case 4:
         {
            png_bytep sp = row + (png_size_t)((row_info->width - 1) >> 1);
            png_bytep dp = row + (png_size_t)((final_width - 1) >> 1);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            png_uint_32 i;
            int jstop = (int)png_pass_inc[pass];

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
               sshift = (((row_info->width + 1) & 0x01) << 2);
               dshift = (((final_width + 1) & 0x01) << 2);
               s_start = 4;
               s_end = 0;
               s_inc = -4;
            }

            else
#endif
            {
               sshift = ((1 - ((row_info->width + 1) & 0x01)) << 2);
               dshift = ((1 - ((final_width + 1) & 0x01)) << 2);
               s_start = 0;
               s_end = 4;
               s_inc = 4;
            }

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v = (png_byte)((*sp >> sshift) & 0x0f);
               int j;

               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0xf0f >> (4 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         default:
         {
            png_size_t pixel_bytes = (row_info->pixel_depth >> 3);

            png_bytep sp = row + (png_size_t)(row_info->width - 1)
                * pixel_bytes;

            png_bytep dp = row + (png_size_t)(final_width - 1) * pixel_bytes;

            int jstop = (int)png_pass_inc[pass];
            png_uint_32 i;

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v[8]; /* SAFE; pixel_depth does not exceed 64 */
               int j;

               memcpy(v, sp, pixel_bytes);

               for (j = 0; j < jstop; j++)
               {
                  memcpy(dp, v, pixel_bytes);
                  dp -= pixel_bytes;
               }

               sp -= pixel_bytes;
            }
            break;
         }
      }

      row_info->width = final_width;
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, final_width);
   }
#ifndef PNG_READ_PACKSWAP_SUPPORTED
   PNG_UNUSED(transformations)  /* Silence compiler warning */
#endif
}